

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pkcs7.c
# Opt level: O1

int pkcs7_wrap(scep *s,int enc_base64)

{
  ulong uVar1;
  X509 *x509;
  int iVar2;
  uint uVar3;
  uint len;
  uchar *buf;
  X509 *bp;
  long lVar4;
  X509 *certs;
  X509 *in;
  BIO_METHOD *pBVar5;
  char **ppcVar6;
  X509 *pXVar7;
  X509 *p7si;
  ASN1_OBJECT *pAVar8;
  int *piVar9;
  BIO *append;
  BIO *b;
  BIO *pBVar10;
  ulong uVar11;
  char *pcVar12;
  ASN1_STRING *pAVar13;
  size_t sVar14;
  X509_ATTRIBUTE *pXVar15;
  char *pcVar16;
  ASN1_STRING *str;
  PKCS7 *pPVar17;
  stack_st_PKCS7_SIGNER_INFO *psVar18;
  FILE *pFVar19;
  FILE *pFVar20;
  X509_STORE *ctx;
  X509_STORE_CTX *ctx_00;
  FILE *pFVar21;
  FILE *b_00;
  X509 **ppXVar22;
  void *__src;
  ASN1_TYPE *pAVar23;
  FILE *pFVar24;
  X509_NAME *pXVar25;
  X509_NAME *b_01;
  X509_EXTENSION *pXVar26;
  ulong uVar27;
  X509 **parg;
  EVP_MD *pEVar28;
  char **ppcVar29;
  EVP_PKEY **buffer_00;
  ulong uVar30;
  uint extraout_EDX;
  char *__s;
  char *data;
  FILE *extraout_RDX;
  undefined8 uVar31;
  X509 *pXVar32;
  FILE *pFVar33;
  char *pcVar34;
  ASN1_STRING *pAVar35;
  int *piVar36;
  char **ppcVar37;
  uchar *buffer;
  uint uStack_26b4;
  PKCS7 *pPStack_26b0;
  BIO *pBStack_26a8;
  long lStack_26a0;
  byte abStack_2698 [64];
  char acStack_2658 [1024];
  char acStack_2258 [1032];
  FILE *pFStack_1e50;
  int *piStack_1e48;
  FILE *pFStack_1e40;
  FILE *pFStack_1e38;
  FILE *pFStack_1e30;
  FILE *pFStack_1e28;
  FILE *pFStack_1e18;
  FILE aFStack_1e10 [4];
  FILE *pFStack_1a08;
  int *piStack_1a00;
  FILE *pFStack_19f8;
  FILE *pFStack_19f0;
  FILE *pFStack_19e8;
  FILE *pFStack_19e0;
  FILE aFStack_19d8 [4];
  FILE aFStack_15d8 [4];
  char acStack_11d8 [2056];
  FILE *pFStack_9d0;
  FILE *pFStack_9c8;
  FILE *pFStack_9c0;
  FILE *pFStack_9b8;
  FILE *pFStack_9b0;
  FILE *pFStack_9a8;
  FILE *pFStack_998;
  FILE *pFStack_990;
  FILE *pFStack_988;
  FILE *pFStack_980;
  FILE *pFStack_978;
  FILE *pFStack_970;
  code *pcStack_968;
  FILE *pFStack_958;
  FILE *pFStack_950;
  FILE *pFStack_948;
  FILE *pFStack_940;
  FILE *pFStack_938;
  FILE *pFStack_930;
  undefined1 auStack_920 [1040];
  ASN1_STRING *pAStack_510;
  FILE *pFStack_508;
  X509_STORE *pXStack_500;
  X509_STORE_CTX *pXStack_4f8;
  FILE *pFStack_4f0;
  FILE *pFStack_4e8;
  undefined1 auStack_4e0 [1032];
  ASN1_STRING *pAStack_d8;
  ASN1_STRING *pAStack_d0;
  ulong uStack_c8;
  ulong uStack_c0;
  code *pcStack_b0;
  X509 *pXStack_a8;
  X509 *pXStack_a0;
  ASN1_STRING *pAStack_90;
  code *pcStack_88;
  X509 *pXStack_78;
  scep *psStack_70;
  X509 *pXStack_68;
  X509 *pXStack_60;
  X509 *local_50;
  char **local_48;
  X509 *local_40;
  X509 *local_38;
  
  local_50 = (X509 *)0x0;
  s->sender_nonce_len = 0x10;
  pXStack_60 = (X509 *)0x10c3b9;
  buf = (uchar *)malloc(0x10);
  pXStack_60 = (X509 *)0x10c3c9;
  RAND_bytes(buf,0x10);
  s->sender_nonce = buf;
  uVar3 = 0x11143c;
  switch(s->request_type) {
  case 0x13:
    s->request_type_str = "19";
    ppcVar6 = (char **)s->signercert;
    certs = (X509 *)s->signerkey;
    piVar9 = &d_flag;
    if (d_flag != 0) {
      pXStack_60 = (X509 *)0x10c423;
      uVar3 = 0x11143c;
      printf("%s: creating inner PKCS#7\n",pname);
    }
    pXStack_60 = (X509 *)0x10c428;
    pBVar5 = BIO_s_mem();
    pXStack_60 = (X509 *)0x10c430;
    bp = (X509 *)BIO_new(pBVar5);
    pXStack_60 = (X509 *)0x10c445;
    in = (X509 *)request;
    pXVar7 = bp;
    iVar2 = i2d_X509_REQ_bio((BIO *)bp,(X509_REQ *)request);
    if (0 < iVar2) {
      pXVar7 = certs;
      if (d_flag != 0) {
        pXStack_60 = (X509 *)0x10c46e;
        printf("%s: inner PKCS#7 in mem BIO \n",pname);
      }
      goto LAB_0010c56c;
    }
    goto LAB_0010cb6c;
  case 0x14:
    goto switchD_0010c3ea_caseD_14;
  case 0x15:
    break;
  case 0x16:
    goto switchD_0010c3ea_caseD_16;
  default:
    goto switchD_0010c3ea_default;
  }
  s->request_type_str = "21";
  pXVar7 = (X509 *)rsa;
  ppcVar6 = (char **)localcert;
  pXStack_60 = (X509 *)0x10c497;
  pBVar5 = BIO_s_mem();
  pXStack_60 = (X509 *)0x10c49f;
  bp = (X509 *)BIO_new(pBVar5);
  pXStack_60 = (X509 *)0x10c4b1;
  iVar2 = i2d_PKCS7_ISSUER_AND_SERIAL_bio((BIO *)bp,s->ias_getcert);
  if (iVar2 != 0) goto LAB_0010c56c;
  pXStack_60 = (X509 *)0x10c4be;
  pkcs7_wrap_cold_2();
switchD_0010c3ea_caseD_16:
  s->request_type_str = "22";
  pXVar7 = (X509 *)rsa;
  ppcVar6 = (char **)localcert;
  pXStack_60 = (X509 *)0x10c4e2;
  pBVar5 = BIO_s_mem();
  pXStack_60 = (X509 *)0x10c4ea;
  bp = (X509 *)BIO_new(pBVar5);
  pXStack_60 = (X509 *)0x10c4fc;
  iVar2 = i2d_PKCS7_ISSUER_AND_SERIAL_bio((BIO *)bp,s->ias_getcrl);
  if (iVar2 == 0) {
    pXStack_60 = (X509 *)0x10c505;
    pkcs7_wrap_cold_1();
switchD_0010c3ea_caseD_14:
    s->request_type_str = "20";
    ppcVar6 = (char **)s->signercert;
    pXVar7 = (X509 *)s->signerkey;
    if (d_flag != 0) {
      pXStack_60 = (X509 *)0x10c53c;
      printf("%s: creating inner PKCS#7\n",pname);
    }
    pXStack_60 = (X509 *)0x10c541;
    pBVar5 = BIO_s_mem();
    pXStack_60 = (X509 *)0x10c549;
    bp = (X509 *)BIO_new(pBVar5);
    pXStack_60 = (X509 *)0x10c55b;
    iVar2 = i2d_PKCS7_ISSUER_AND_SUBJECT_bio((BIO *)bp,s->ias_getcertinit);
    if (iVar2 == 0) {
      pXStack_60 = (X509 *)0x10c564;
      pkcs7_wrap_cold_3();
switchD_0010c3ea_default:
      bp = (X509 *)0x0;
      ppcVar6 = (char **)0x0;
      pXVar7 = (X509 *)0x0;
    }
  }
LAB_0010c56c:
  pXStack_60 = (X509 *)0x10c57d;
  lVar4 = BIO_ctrl((BIO *)bp,0xb,0,(void *)0x0);
  if ((int)lVar4 < 1) {
    pXStack_60 = (X509 *)0x10cb26;
    pkcs7_wrap_cold_5();
  }
  pXStack_60 = (X509 *)0x10c592;
  BIO_set_flags((BIO *)bp,0x200);
  piVar9 = (int *)&s->request_payload;
  pXVar32 = (X509 *)0x3;
  pXStack_60 = (X509 *)0x10c5ab;
  ppcVar29 = (char **)piVar9;
  lVar4 = BIO_ctrl((BIO *)bp,3,0,piVar9);
  s->request_len = (int)lVar4;
  if (v_flag != 0) {
    pXStack_60 = (X509 *)0x10c5d6;
    printf("%s: request data dump \n",pname);
    pXStack_60 = (X509 *)0x10c5ef;
    pXVar32 = (X509 *)request;
    PEM_write_X509_REQ(_stdout,(X509_REQ *)request);
  }
  local_40 = pXVar7;
  local_38 = (X509 *)ppcVar6;
  if (v_flag != 0) {
    pXStack_60 = (X509 *)0x10c624;
    pXVar32 = (X509 *)pname;
    printf("%s: data payload size: %d bytes\n",pname,(ulong)(uint)s->request_len);
  }
  pcVar34 = (char *)0x0;
  pXStack_60 = (X509 *)0x10c62b;
  certs = (X509 *)OPENSSL_sk_new();
  uVar3 = (uint)ppcVar29;
  if (certs == (X509 *)0x0) {
    pXStack_60 = (X509 *)0x10cb30;
    pkcs7_wrap_cold_19();
LAB_0010cb30:
    in = pXVar32;
    pXStack_60 = (X509 *)0x10cb35;
    pkcs7_wrap_cold_17();
LAB_0010cb35:
    pXVar32 = (X509 *)piVar9;
    pXStack_60 = (X509 *)0x10cb3a;
    pkcs7_wrap_cold_16();
    certs = pXVar7;
LAB_0010cb3a:
    pXStack_60 = (X509 *)0x10cb3f;
    pkcs7_wrap_cold_15();
LAB_0010cb3f:
    pXVar7 = (X509 *)pcVar34;
    pXStack_60 = (X509 *)0x10cb44;
    pkcs7_wrap_cold_14();
LAB_0010cb44:
    pXStack_60 = (X509 *)0x10cb49;
    pkcs7_wrap_cold_13();
LAB_0010cb49:
    p7si = pXVar32;
    pXStack_60 = (X509 *)0x10cb4e;
    pkcs7_wrap_cold_12();
LAB_0010cb4e:
    pXStack_60 = (X509 *)0x10cb53;
    pkcs7_wrap_cold_11();
LAB_0010cb53:
    pXStack_60 = (X509 *)0x10cb58;
    pkcs7_wrap_cold_10();
LAB_0010cb58:
    piVar9 = (int *)p7si;
    pXStack_60 = (X509 *)0x10cb5d;
    pkcs7_wrap_cold_9();
LAB_0010cb5d:
    pXStack_60 = (X509 *)0x10cb62;
    pkcs7_wrap_cold_7();
LAB_0010cb62:
    pXStack_60 = (X509 *)0x10cb67;
    pkcs7_wrap_cold_8();
  }
  else {
    local_48 = (char **)piVar9;
    if (encert != (X509 *)0x0) {
      pXStack_60 = (X509 *)0x10c653;
      iVar2 = OPENSSL_sk_push(certs);
      if (iVar2 < 1) {
        pXStack_60 = (X509 *)0x10c65c;
        pkcs7_wrap_cold_6();
        goto LAB_0010c65c;
      }
LAB_0010c676:
      uVar3 = (uint)ppcVar29;
      if (d_flag != 0) {
        piVar9 = (int *)0x0;
        pXStack_60 = (X509 *)0x10c69d;
        printf("\n %s: hexdump request payload\n",pname);
        uVar3 = (uint)ppcVar29;
        if (0 < s->request_len) {
          piVar9 = (int *)0x0;
          do {
            pXStack_60 = (X509 *)0x10c6c5;
            printf("%02x",(ulong)(uint)(int)s->request_payload[(long)piVar9]);
            uVar3 = (uint)ppcVar29;
            piVar9 = (int *)((long)&((X509 *)piVar9)->cert_info + 1);
          } while ((long)piVar9 < (long)s->request_len);
        }
        ppcVar6 = &pname;
        pXStack_60 = (X509 *)0x10c6ef;
        printf("\n %s: hexdump payload %d \n",pname,(ulong)piVar9 & 0xffffffff);
      }
      pcVar34 = s->request_payload;
      pXVar32 = (X509 *)(ulong)(uint)s->request_len;
      pXStack_60 = (X509 *)0x10c702;
      in = (X509 *)BIO_new_mem_buf(pcVar34,s->request_len);
      pXVar7 = certs;
      if (in == (X509 *)0x0) goto LAB_0010cb30;
      uVar3 = 0x80;
      pXStack_60 = (X509 *)0x10c725;
      pcVar34 = (char *)certs;
      pXVar32 = (X509 *)PKCS7_encrypt((stack_st_X509 *)certs,(BIO *)in,(EVP_CIPHER *)enc_alg,0x80);
      if (pXVar32 == (X509 *)0x0) goto LAB_0010cb35;
      if (v_flag != 0) {
        pXStack_60 = (X509 *)0x10c755;
        printf("%s: successfully encrypted payload\n",pname);
      }
      pXStack_60 = (X509 *)0x10c75a;
      pBVar5 = BIO_s_mem();
      pXStack_60 = (X509 *)0x10c762;
      ppcVar6 = (char **)BIO_new(pBVar5);
      pXStack_60 = (X509 *)0x10c770;
      in = pXVar32;
      pcVar34 = (char *)ppcVar6;
      iVar2 = i2d_PKCS7_bio((BIO *)ppcVar6,(PKCS7 *)pXVar32);
      if (iVar2 < 1) goto LAB_0010cb3a;
      pXStack_60 = (X509 *)0x10c789;
      BIO_ctrl((BIO *)ppcVar6,0xb,0,(void *)0x0);
      pXStack_60 = (X509 *)0x10c796;
      BIO_set_flags((BIO *)ppcVar6,0x200);
      parg = &local_50;
      in = (X509 *)0x3;
      pXStack_60 = (X509 *)0x10c7aa;
      certs = (X509 *)BIO_ctrl((BIO *)ppcVar6,3,0,parg);
      uVar3 = (uint)parg;
      if (v_flag != 0) {
        pXStack_60 = (X509 *)0x10c7d3;
        in = (X509 *)pname;
        printf("%s: envelope size: %d bytes\n",pname,(ulong)certs & 0xffffffff);
      }
      if (d_flag != 0) {
        pXStack_60 = (X509 *)0x10c7f7;
        printf("%s: printing PEM fomatted PKCS#7\n",pname);
        pXStack_60 = (X509 *)0x10c809;
        in = pXVar32;
        PEM_write_PKCS7(_stdout,(PKCS7 *)pXVar32);
      }
      pXStack_60 = (X509 *)0x10c811;
      pcVar34 = (char *)ppcVar6;
      BIO_free((BIO *)ppcVar6);
      if (v_flag != 0) {
        pcVar34 = "%s: creating outer PKCS#7\n";
        pXStack_60 = (X509 *)0x10c835;
        in = (X509 *)pname;
        printf("%s: creating outer PKCS#7\n");
      }
      pXStack_60 = (X509 *)0x10c83a;
      pXVar7 = (X509 *)PKCS7_new();
      s->request_p7 = (PKCS7 *)pXVar7;
      if (pXVar7 == (X509 *)0x0) goto LAB_0010cb3f;
      in = (X509 *)0x16;
      pXStack_60 = (X509 *)0x10c857;
      iVar2 = PKCS7_set_type((PKCS7 *)pXVar7,0x16);
      x509 = local_38;
      if (iVar2 == 0) goto LAB_0010cb44;
      pXStack_60 = (X509 *)0x10c873;
      PKCS7_add_certificate((PKCS7 *)s->request_p7,local_38);
      pXVar7 = (X509 *)s->request_p7;
      pXStack_60 = (X509 *)0x10c891;
      pEVar28 = sig_alg;
      in = x509;
      p7si = (X509 *)PKCS7_add_signature((PKCS7 *)pXVar7,x509,(EVP_PKEY *)local_40,(EVP_MD *)sig_alg
                                        );
      uVar3 = (uint)pEVar28;
      pXVar32 = x509;
      if (p7si == (X509 *)0x0) goto LAB_0010cb49;
      if (d_flag != 0) {
        pXStack_60 = (X509 *)0x10c8c1;
        printf("%s: signature added successfully\n",pname);
      }
      if (d_flag != 0) {
        pXStack_60 = (X509 *)0x10c8e5;
        printf("%s: adding signed attributes\n",pname);
      }
      pXStack_60 = (X509 *)0x10c8ea;
      ppcVar6 = (char **)OPENSSL_sk_new_null();
      pXStack_60 = (X509 *)0x10c902;
      add_attribute_string((stack_st_X509_ATTRIBUTE *)ppcVar6,nid_transId,s->transaction_id);
      pXStack_60 = (X509 *)0x10c917;
      add_attribute_string((stack_st_X509_ATTRIBUTE *)ppcVar6,nid_messageType,s->request_type_str);
      pXStack_60 = (X509 *)0x10c930;
      add_attribute_octet((stack_st_X509_ATTRIBUTE *)ppcVar6,nid_senderNonce,s->sender_nonce,
                          s->sender_nonce_len);
      pXStack_60 = (X509 *)0x10c93b;
      PKCS7_set_signed_attributes((PKCS7_SIGNER_INFO *)p7si,(stack_st_X509_ATTRIBUTE *)ppcVar6);
      pXStack_60 = (X509 *)0x10c945;
      pAVar8 = OBJ_nid2obj(0x15);
      in = (X509 *)0x32;
      pXStack_60 = (X509 *)0x10c95a;
      pXVar7 = p7si;
      iVar2 = PKCS7_add_signed_attribute((PKCS7_SIGNER_INFO *)p7si,0x32,6,pAVar8);
      uVar3 = (uint)pAVar8;
      if (iVar2 == 0) goto LAB_0010cb4e;
      pXVar7 = (X509 *)s->request_p7;
      in = (X509 *)0x15;
      pXStack_60 = (X509 *)0x10c973;
      iVar2 = PKCS7_content_new((PKCS7 *)pXVar7,0x15);
      if (iVar2 == 0) goto LAB_0010cb53;
      pXVar7 = (X509 *)s->request_p7;
      in = (X509 *)0x0;
      pXStack_60 = (X509 *)0x10c989;
      piVar9 = (int *)PKCS7_dataInit((PKCS7 *)pXVar7,(BIO *)0x0);
      if ((X509 *)piVar9 == (X509 *)0x0) goto LAB_0010cb58;
      pXStack_60 = (X509 *)0x10c9a4;
      in = local_50;
      pXVar7 = (X509 *)piVar9;
      iVar2 = BIO_write((BIO *)piVar9,local_50,(int)certs);
      if (iVar2 != (int)certs) goto LAB_0010cb5d;
      if (v_flag != 0) {
        pXStack_60 = (X509 *)0x10c9d0;
        printf("%s: PKCS#7 data written successfully\n",pname);
      }
      pXVar7 = (X509 *)s->request_p7;
      pXStack_60 = (X509 *)0x10c9df;
      in = (X509 *)piVar9;
      iVar2 = PKCS7_dataFinal((PKCS7 *)pXVar7,(BIO *)piVar9);
      if (iVar2 != 0) {
        if (d_flag != 0) {
          pXStack_60 = (X509 *)0x10ca0b;
          printf("%s: printing PEM fomatted PKCS#7\n",pname);
          pXStack_60 = (X509 *)0x10ca21;
          PEM_write_PKCS7(_stdout,(PKCS7 *)s->request_p7);
        }
        if ((enc_base64 != 0) && (v_flag != 0)) {
          pXStack_60 = (X509 *)0x10ca4a;
          printf("%s: applying base64 encoding\n",pname);
        }
        pXStack_60 = (X509 *)0x10ca4f;
        pBVar5 = BIO_s_mem();
        pXStack_60 = (X509 *)0x10ca57;
        append = BIO_new(pBVar5);
        pXStack_60 = (X509 *)0x10ca5f;
        pBVar5 = BIO_f_base64();
        pXStack_60 = (X509 *)0x10ca67;
        b = BIO_new(pBVar5);
        pBVar10 = append;
        if (enc_base64 != 0) {
          pXStack_60 = (X509 *)0x10ca7a;
          pBVar10 = BIO_push(b,append);
        }
        pXStack_60 = (X509 *)0x10ca8c;
        i2d_PKCS7_bio(pBVar10,(PKCS7 *)s->request_p7);
        pXStack_60 = (X509 *)0x10ca9d;
        BIO_ctrl(pBVar10,0xb,0,(void *)0x0);
        pXStack_60 = (X509 *)0x10caaa;
        BIO_set_flags(append,0x200);
        pXStack_60 = (X509 *)0x10cabe;
        uVar11 = BIO_ctrl(append,3,0,local_48);
        s->request_len = (int)uVar11;
        if (v_flag != 0) {
          pcVar34 = "";
          if (enc_base64 != 0) {
            pcVar34 = "base64 encoded ";
          }
          pXStack_60 = (X509 *)0x10cb00;
          printf("%s: %spayload size: %d bytes\n",pname,pcVar34,uVar11 & 0xffffffff);
        }
        pXStack_60 = (X509 *)0x10cb08;
        BIO_free(pBVar10);
        pXStack_60 = (X509 *)0x10cb10;
        BIO_free((BIO *)bp);
        return 0;
      }
      goto LAB_0010cb62;
    }
LAB_0010c65c:
    pXStack_60 = (X509 *)0x10c66e;
    in = (X509 *)cacert;
    pXVar7 = certs;
    iVar2 = OPENSSL_sk_push();
    uVar3 = (uint)ppcVar29;
    if (0 < iVar2) goto LAB_0010c676;
  }
  pXStack_60 = (X509 *)0x10cb6c;
  pkcs7_wrap_cold_18();
LAB_0010cb6c:
  pXStack_60 = (X509 *)add_attribute_string;
  pkcs7_wrap_cold_4();
  pcVar34 = pname;
  pXStack_78 = (X509 *)piVar9;
  psStack_70 = s;
  pXStack_68 = bp;
  pXStack_60 = certs;
  if (d_flag != 0) {
    pcStack_88 = (code *)0x10cb9d;
    pcVar12 = OBJ_nid2sn((int)in);
    pcStack_88 = (code *)0x10cbb1;
    printf("%s: adding string attribute %s\n",pcVar34,pcVar12);
  }
  pcStack_88 = (code *)0x10cbb6;
  pAVar13 = ASN1_STRING_new();
  pcStack_88 = (code *)0x10cbc1;
  sVar14 = strlen(__s);
  pcStack_88 = (code *)0x10cbce;
  pcVar34 = __s;
  pAVar35 = pAVar13;
  iVar2 = ASN1_STRING_set(pAVar13,__s,(int)sVar14);
  if (0 < iVar2) {
    pcStack_88 = (code *)0x10cbe1;
    pXVar15 = X509_ATTRIBUTE_create((int)in,0x13,pAVar13);
    pcStack_88 = (code *)0x10cbec;
    OPENSSL_sk_push(pXVar7,pXVar15);
    return 0;
  }
  pcStack_88 = add_attribute_octet;
  add_attribute_string_cold_1();
  pcVar12 = pname;
  pXStack_a8 = pXVar7;
  pXStack_a0 = (X509 *)ppcVar6;
  pAStack_90 = pAVar13;
  pcStack_88 = (code *)((ulong)in & 0xffffffff);
  if (d_flag != 0) {
    pcStack_b0 = (code *)0x10cc2e;
    pcVar16 = OBJ_nid2sn((int)pcVar34);
    pcStack_b0 = (code *)0x10cc42;
    printf("%s: adding octet attribute %s\n",pcVar12,pcVar16);
  }
  pcStack_b0 = (code *)0x10cc47;
  str = ASN1_STRING_new();
  pcStack_b0 = (code *)0x10cc58;
  pcVar12 = data;
  pAVar13 = str;
  iVar2 = ASN1_STRING_set(str,data,uVar3);
  if (0 < iVar2) {
    pcStack_b0 = (code *)0x10cc6b;
    pXVar15 = X509_ATTRIBUTE_create((int)pcVar34,4,str);
    pcStack_b0 = (code *)0x10cc76;
    OPENSSL_sk_push(pAVar35,pXVar15);
    return 0;
  }
  pcStack_b0 = pkcs7_verify_unwrap;
  add_attribute_octet_cold_1();
  pFStack_4e8 = (FILE *)0x10cca2;
  pAStack_d8 = pAVar35;
  pAStack_d0 = str;
  uStack_c8 = (ulong)(uint)enc_base64;
  uStack_c0 = (ulong)uVar3;
  pcStack_b0 = (code *)((ulong)pcVar34 & 0xffffffff);
  pBVar5 = BIO_s_mem();
  pFStack_4e8 = (FILE *)0x10ccaa;
  pBVar10 = BIO_new(pBVar5);
  if (v_flag != 0) {
    pFStack_4e8 = (FILE *)0x10ccd1;
    printf("%s: reading outer PKCS#7\n",pname);
  }
  pFStack_4e8 = (FILE *)0x10cce6;
  uVar3 = BIO_write(pBVar10,*(void **)(pAVar13 + 8),*(int *)&pAVar13[8].data);
  if ((int)uVar3 < 1) {
    pFStack_4e8 = (FILE *)0x10d070;
    pkcs7_verify_unwrap_cold_12();
LAB_0010d070:
    pFStack_4e8 = (FILE *)0x10d075;
    pkcs7_verify_unwrap_cold_11();
LAB_0010d075:
    pFStack_4e8 = (FILE *)0x10d07a;
    pkcs7_verify_unwrap_cold_1();
LAB_0010d07a:
    pFStack_4e8 = (FILE *)0x10d07f;
    pkcs7_verify_unwrap_cold_10();
  }
  else {
    if (v_flag != 0) {
      pFStack_4e8 = (FILE *)0x10cd14;
      printf("%s: PKCS#7 payload size: %d bytes\n",pname,(ulong)uVar3);
    }
    pFStack_4e8 = (FILE *)0x10cd21;
    BIO_set_flags(pBVar10,0x200);
    pFStack_4e8 = (FILE *)0x10cd2b;
    pPVar17 = d2i_PKCS7_bio(pBVar10,(PKCS7 **)0x0);
    pAVar13[7].flags = (long)pPVar17;
    if (pPVar17 == (PKCS7 *)0x0) goto LAB_0010d070;
    if (d_flag != 0) {
      pFStack_4e8 = (FILE *)0x10cd5f;
      printf("%s: printing PEM fomatted PKCS#7\n",pname);
      pFStack_4e8 = (FILE *)0x10cd75;
      PEM_write_PKCS7(_stdout,(PKCS7 *)pAVar13[7].flags);
    }
    pFStack_4e8 = (FILE *)0x10cd85;
    iVar2 = OBJ_obj2nid(*(ASN1_OBJECT **)(pAVar13[7].flags + 0x18));
    if (iVar2 != 0x16) goto LAB_0010d075;
    pFStack_4e8 = (FILE *)0x10cd9c;
    pBVar10 = PKCS7_dataInit((PKCS7 *)pAVar13[7].flags,(BIO *)0x0);
    if (pBVar10 == (BIO *)0x0) goto LAB_0010d07a;
    pFStack_4e8 = (FILE *)0x10cdad;
    pBVar5 = BIO_s_mem();
    pFStack_4e8 = (FILE *)0x10cdb5;
    ppcVar6 = (char **)BIO_new(pBVar5);
    pFStack_4e8 = (FILE *)0x10cdc8;
    uVar3 = BIO_read(pBVar10,auStack_4e0,0x400);
    len = uVar3;
    while (0 < (int)len) {
      pFStack_4e8 = (FILE *)0x10cde0;
      BIO_write((BIO *)ppcVar6,auStack_4e0,len);
      pFStack_4e8 = (FILE *)0x10cdf0;
      len = BIO_read(pBVar10,auStack_4e0,0x400);
      uVar3 = uVar3 + len;
    }
    pFStack_4e8 = (FILE *)0x10ce07;
    BIO_ctrl((BIO *)ppcVar6,0xb,0,(void *)0x0);
    if (v_flag != 0) {
      pFStack_4e8 = (FILE *)0x10ce2d;
      printf("%s: PKCS#7 contains %d bytes of signed data\n",pname,(ulong)uVar3);
    }
    pFStack_4e8 = (FILE *)0x10ce39;
    psVar18 = PKCS7_get_signer_info((PKCS7 *)pAVar13[7].flags);
    if (psVar18 != (stack_st_PKCS7_SIGNER_INFO *)0x0) {
      if (v_flag != 0) {
        pFStack_4e8 = (FILE *)0x10ce69;
        printf("%s: verifying signature\n",pname);
      }
      pFStack_4e8 = (FILE *)0x10ce73;
      pFVar19 = (FILE *)OPENSSL_sk_value(psVar18,0);
      pFStack_4e8 = (FILE *)0x10ce85;
      pFVar20 = (FILE *)PKCS7_cert_from_signer_info
                                  ((PKCS7 *)pAVar13[7].flags,(PKCS7_SIGNER_INFO *)pFVar19);
      if (pFVar20 == (FILE *)0x0) {
        pFStack_4e8 = (FILE *)0x10cea5;
        printf("%s: Can\'t read signer cert from pkcs7\n",pname);
      }
      pFStack_4e8 = (FILE *)0x10ceba;
      iVar2 = PKCS7_signatureVerify
                        (pBVar10,(PKCS7 *)pAVar13[7].flags,(PKCS7_SIGNER_INFO *)pFVar19,
                         (X509 *)pFVar20);
      if (iVar2 < 1) goto LAB_0010d084;
      if (v_flag != 0) {
        pFStack_4e8 = (FILE *)0x10cee6;
        printf("%s: signature ok\n");
      }
      pFStack_4e8 = (FILE *)0x10ceeb;
      ctx = X509_STORE_new();
      if (ctx == (X509_STORE *)0x0) {
        pFStack_4e8 = (FILE *)0x10d048;
        pkcs7_verify_unwrap_cold_2();
      }
      pFStack_4e8 = (FILE *)0x10cf01;
      X509_STORE_set_flags(ctx,0);
      pFStack_4e8 = (FILE *)0x10cf0e;
      X509_STORE_load_locations(ctx,pcVar12,(char *)0x0);
      pFStack_4e8 = (FILE *)0x10cf13;
      ctx_00 = X509_STORE_CTX_new();
      if (ctx_00 == (X509_STORE_CTX *)0x0) {
        pFStack_4e8 = (FILE *)0x10d052;
        pkcs7_verify_unwrap_cold_3();
      }
      buffer_00 = (EVP_PKEY **)0x0;
      pFStack_4e8 = (FILE *)0x10cf2f;
      iVar2 = X509_STORE_CTX_init(ctx_00,ctx,(X509 *)pFVar20,(stack_st_X509 *)0x0);
      if (iVar2 == 0) {
        pFStack_4e8 = (FILE *)0x10d05c;
        pkcs7_verify_unwrap_cold_4();
      }
      pFStack_4e8 = (FILE *)0x10cf3f;
      iVar2 = X509_verify_cert(ctx_00);
      if (iVar2 == 0) {
        pFStack_4e8 = (FILE *)0x10d066;
        pkcs7_verify_unwrap_cold_5();
      }
      pFVar21 = pFVar19;
      if (w_flag == 0) {
LAB_0010d005:
        pFStack_4e8 = (FILE *)0x10d00f;
        pFVar24 = (FILE *)ppcVar6;
        pPVar17 = d2i_PKCS7_bio((BIO *)ppcVar6,(PKCS7 **)0x0);
        pAVar13[7].flags = (long)pPVar17;
        if (pPVar17 != (PKCS7 *)0x0) {
          pFStack_4e8 = (FILE *)0x10d027;
          X509_STORE_free(ctx);
          pFStack_4e8 = (FILE *)0x10d02f;
          X509_STORE_CTX_cleanup(ctx_00);
          return 0;
        }
        pFStack_4e8 = (FILE *)0x10d0ba;
        pkcs7_verify_unwrap_cold_8();
        pFVar19 = pFVar21;
LAB_0010d0ba:
        pFVar21 = pFVar19;
        pFStack_4e8 = (FILE *)0x10d0bf;
        pkcs7_verify_unwrap_cold_7();
      }
      else {
        pFStack_4e8 = (FILE *)0x10cf6d;
        pFVar24 = (FILE *)w_char;
        pFVar21 = fopen(w_char,"w");
        if (pFVar21 == (FILE *)0x0) goto LAB_0010d0ba;
        if (v_flag != 0) {
          pFStack_4e8 = (FILE *)0x10cf9d;
          printf("%s: writing cert\n",w_char);
        }
        if (d_flag != 0) {
          pFStack_4e8 = (FILE *)0x10cfbb;
          PEM_write_X509(_stdout,(X509 *)pFVar20);
        }
        pFStack_4e8 = (FILE *)0x10cfc6;
        pFVar24 = pFVar21;
        iVar2 = PEM_write_X509(pFVar21,(X509 *)pFVar20);
        if (iVar2 == 1) {
          if (v_flag != 0) {
            pFStack_4e8 = (FILE *)0x10cffd;
            printf("%s: certificate written as %s\n",pname,w_char);
          }
          pFStack_4e8 = (FILE *)0x10d005;
          fclose(pFVar21);
          goto LAB_0010d005;
        }
      }
      pFStack_4e8 = (FILE *)pkcs7_unwrap;
      pkcs7_verify_unwrap_cold_6();
      pFStack_930 = (FILE *)0x10d0dd;
      pAStack_510 = pAVar13;
      pFStack_508 = pFVar20;
      pXStack_500 = ctx;
      pXStack_4f8 = ctx_00;
      pFStack_4f0 = (FILE *)ppcVar6;
      pFStack_4e8 = pFVar21;
      pBVar5 = BIO_s_mem();
      pFStack_930 = (FILE *)0x10d0e5;
      pFVar19 = (FILE *)BIO_new(pBVar5);
      piVar9 = &v_flag;
      if (v_flag != 0) {
        pFStack_930 = (FILE *)0x10d10e;
        printf("%s: reading outer PKCS#7\n",pname);
      }
      pFVar33 = *(FILE **)&pFVar24->_mode;
      pFStack_930 = (FILE *)0x10d123;
      pcVar34 = (char *)pFVar19;
      uVar3 = BIO_write((BIO *)pFVar19,pFVar33,*(int *)(pFVar24->_unused2 + 4));
      if ((int)uVar3 < 1) {
        pFStack_930 = (FILE *)0x10d77a;
        pkcs7_unwrap_cold_21();
LAB_0010d77a:
        pFStack_930 = (FILE *)0x10d77f;
        pkcs7_unwrap_cold_1();
LAB_0010d77f:
        pFStack_930 = (FILE *)0x10d784;
        pkcs7_unwrap_cold_20();
LAB_0010d784:
        pFStack_930 = (FILE *)0x10d789;
        pkcs7_unwrap_cold_19();
LAB_0010d789:
        pFStack_930 = (FILE *)0x10d78e;
        pkcs7_unwrap_cold_18();
LAB_0010d78e:
        pFStack_930 = (FILE *)0x10d793;
        pkcs7_unwrap_cold_17();
LAB_0010d793:
        pcVar12 = (char *)pFVar20;
        pFStack_930 = (FILE *)0x10d798;
        pkcs7_unwrap_cold_2();
LAB_0010d798:
        pFStack_930 = (FILE *)0x10d79d;
        pkcs7_unwrap_cold_3();
LAB_0010d79d:
        pFStack_930 = (FILE *)0x10d7a2;
        pkcs7_unwrap_cold_4();
LAB_0010d7a2:
        pFStack_930 = (FILE *)0x10d7a7;
        pkcs7_unwrap_cold_5();
LAB_0010d7a7:
        pFStack_930 = (FILE *)0x10d7ac;
        pkcs7_unwrap_cold_7();
LAB_0010d7ac:
        pFStack_930 = (FILE *)0x10d7b1;
        pkcs7_unwrap_cold_9();
LAB_0010d7b1:
        pFStack_930 = (FILE *)0x10d7b6;
        pkcs7_unwrap_cold_10();
LAB_0010d7b6:
        pFStack_930 = (FILE *)0x10d7bb;
        pkcs7_unwrap_cold_11();
LAB_0010d7bb:
        pFStack_930 = (FILE *)0x10d7c0;
        pkcs7_unwrap_cold_15();
LAB_0010d7c0:
        pFVar20 = pFVar21;
        pFStack_930 = (FILE *)0x10d7c5;
        pkcs7_unwrap_cold_14();
LAB_0010d7c5:
        pFStack_930 = (FILE *)0x10d7ca;
        pkcs7_unwrap_cold_13();
      }
      else {
        if (v_flag != 0) {
          ppcVar29 = &pname;
          pFStack_930 = (FILE *)0x10d14c;
          printf("%s: PKCS#7 payload size: %d bytes\n",pname,(ulong)uVar3);
          buffer_00 = (EVP_PKEY **)ppcVar29;
        }
        pFStack_930 = (FILE *)0x10d159;
        BIO_set_flags((BIO *)pFVar19,0x200);
        pFVar33 = (FILE *)0x0;
        pFStack_930 = (FILE *)0x10d163;
        pPVar17 = d2i_PKCS7_bio((BIO *)pFVar19,(PKCS7 **)0x0);
        pFVar24->__pad5 = (size_t)pPVar17;
        if (d_flag != 0) {
          pFStack_930 = (FILE *)0x10d18e;
          printf("%s: printing PEM fomatted PKCS#7\n",pname);
          pFVar33 = (FILE *)pFVar24->__pad5;
          pFStack_930 = (FILE *)0x10d1a4;
          PEM_write_PKCS7(_stdout,(PKCS7 *)pFVar33);
        }
        pcVar34 = *(char **)(pFVar24->__pad5 + 0x18);
        pFStack_930 = (FILE *)0x10d1b4;
        iVar2 = OBJ_obj2nid((ASN1_OBJECT *)pcVar34);
        if (iVar2 != 0x16) goto LAB_0010d77a;
        pcVar34 = (char *)pFVar24->__pad5;
        pFVar33 = (FILE *)0x0;
        pFStack_930 = (FILE *)0x10d1cb;
        b_00 = (FILE *)PKCS7_dataInit((PKCS7 *)pcVar34,(BIO *)0x0);
        if (b_00 == (FILE *)0x0) goto LAB_0010d77f;
        pFStack_930 = (FILE *)0x10d1dc;
        pBVar5 = BIO_s_mem();
        pFStack_930 = (FILE *)0x10d1e4;
        pFVar19 = (FILE *)BIO_new(pBVar5);
        pFStack_930 = (FILE *)0x10d1f9;
        uVar3 = BIO_read((BIO *)b_00,auStack_920 + 8,0x400);
        pFVar33 = (FILE *)(ulong)uVar3;
        pFVar21 = pFVar33;
        if (0 < (int)uVar3) {
          pFVar20 = (FILE *)(auStack_920 + 8);
          do {
            pFStack_930 = (FILE *)0x10d213;
            BIO_write((BIO *)pFVar19,pFVar20,(int)pFVar33);
            pFStack_930 = (FILE *)0x10d223;
            uVar3 = BIO_read((BIO *)b_00,pFVar20,0x400);
            pFVar33 = (FILE *)(ulong)uVar3;
            pFVar21 = (FILE *)(ulong)((int)pFVar21 + uVar3);
          } while (0 < (int)uVar3);
        }
        pFVar33 = (FILE *)0xb;
        buffer_00 = (EVP_PKEY **)0x0;
        pFStack_930 = (FILE *)0x10d23a;
        BIO_ctrl((BIO *)pFVar19,0xb,0,(void *)0x0);
        if (v_flag != 0) {
          pFStack_930 = (FILE *)0x10d25b;
          pFVar33 = (FILE *)pname;
          printf("%s: PKCS#7 contains %d bytes of enveloped data\n",pname,pFVar21);
        }
        pcVar34 = (char *)pFVar24->__pad5;
        pFStack_930 = (FILE *)0x10d267;
        psVar18 = PKCS7_get_signer_info((PKCS7 *)pcVar34);
        ppcVar6 = (char **)b_00;
        if (psVar18 == (stack_st_PKCS7_SIGNER_INFO *)0x0) goto LAB_0010d784;
        if (v_flag != 0) {
          pFStack_930 = (FILE *)0x10d292;
          printf("%s: verifying signature\n",pname);
        }
        pFStack_930 = (FILE *)0x10d29c;
        pFVar20 = (FILE *)OPENSSL_sk_value(psVar18,0);
        pFVar33 = (FILE *)pFVar24->__pad5;
        pFStack_930 = (FILE *)0x10d2bb;
        buffer_00 = (EVP_PKEY **)cacert;
        pcVar34 = (char *)b_00;
        iVar2 = PKCS7_signatureVerify
                          ((BIO *)b_00,(PKCS7 *)pFVar33,(PKCS7_SIGNER_INFO *)pFVar20,(X509 *)cacert)
        ;
        if (iVar2 < 1) goto LAB_0010d789;
        if (v_flag != 0) {
          pcVar34 = "%s: signature ok\n";
          pFStack_930 = (FILE *)0x10d2e2;
          pFVar33 = (FILE *)pname;
          printf("%s: signature ok\n");
        }
        if (d_flag != 0) {
          pcVar34 = "%s: finding signed attributes\n";
          pFStack_930 = (FILE *)0x10d306;
          pFVar33 = (FILE *)pname;
          printf("%s: finding signed attributes\n");
        }
        ppcVar6 = (char **)pFVar20->_IO_read_base;
        if ((FILE *)ppcVar6 == (FILE *)0x0) goto LAB_0010d78e;
        pFVar33 = (FILE *)(ulong)(uint)nid_transId;
        buffer_00 = (EVP_PKEY **)auStack_920;
        pFStack_930 = (FILE *)0x10d32f;
        pcVar34 = (char *)ppcVar6;
        iVar2 = get_signed_attribute
                          ((stack_st_X509_ATTRIBUTE *)ppcVar6,nid_transId,0x13,(char **)buffer_00);
        pcVar12 = (char *)auStack_920._0_8_;
        if (iVar2 != 0) goto LAB_0010d793;
        pFStack_930 = (FILE *)0x10d357;
        printf("%s: reply transaction id: %s\n",pname,auStack_920._0_8_);
        piVar9 = (int *)pFVar24->_IO_buf_end;
        pFStack_930 = (FILE *)0x10d363;
        sVar14 = strlen(pcVar12);
        pFStack_930 = (FILE *)0x10d371;
        pFVar33 = (FILE *)pcVar12;
        pcVar34 = (char *)piVar9;
        iVar2 = strncmp((char *)piVar9,pcVar12,sVar14);
        if (iVar2 != 0) goto LAB_0010d798;
        pFVar33 = (FILE *)(ulong)(uint)nid_messageType;
        buffer_00 = (EVP_PKEY **)auStack_920;
        pFStack_930 = (FILE *)0x10d394;
        pcVar34 = (char *)ppcVar6;
        iVar2 = get_signed_attribute
                          ((stack_st_X509_ATTRIBUTE *)ppcVar6,nid_messageType,0x13,
                           (char **)buffer_00);
        piVar9 = &v_flag;
        if (iVar2 != 0) goto LAB_0010d79d;
        pFStack_930 = (FILE *)0x10d3ad;
        pcVar34 = (char *)auStack_920._0_8_;
        iVar2 = atoi((char *)auStack_920._0_8_);
        if (iVar2 != 3) goto LAB_0010d7a2;
        if (v_flag != 0) {
          pFStack_930 = (FILE *)0x10d3d5;
          printf("%s: reply message type is good\n",pname);
        }
        pFStack_930 = (FILE *)0x10d3f0;
        iVar2 = get_signed_attribute
                          ((stack_st_X509_ATTRIBUTE *)ppcVar6,nid_senderNonce,4,(char **)auStack_920
                          );
        if ((iVar2 != 0) && (v_flag != 0)) {
          pFStack_930 = (FILE *)0x10d766;
          pkcs7_unwrap_cold_6();
        }
        pFVar24->_markers = (_IO_marker *)auStack_920._0_8_;
        if (v_flag != 0) {
          pFStack_930 = (FILE *)0x10d427;
          printf("%s: senderNonce in reply: ",pname);
          pcVar12 = "%02X";
          lVar4 = 0;
          do {
            pFStack_930 = (FILE *)0x10d444;
            printf("%02X",(ulong)*(byte *)((long)&pFVar24->_markers->_next + lVar4));
            lVar4 = lVar4 + 1;
          } while (lVar4 != 0x10);
          pFStack_930 = (FILE *)0x10d457;
          putchar(10);
        }
        piVar9 = &v_flag;
        pFVar33 = (FILE *)(ulong)(uint)nid_recipientNonce;
        buffer_00 = (EVP_PKEY **)auStack_920;
        pFStack_930 = (FILE *)0x10d479;
        pcVar34 = (char *)ppcVar6;
        iVar2 = get_signed_attribute
                          ((stack_st_X509_ATTRIBUTE *)ppcVar6,nid_recipientNonce,4,
                           (char **)buffer_00);
        if (iVar2 != 0) goto LAB_0010d7a7;
        pFVar24->_IO_save_end = (char *)auStack_920._0_8_;
        if (v_flag != 0) {
          pFStack_930 = (FILE *)0x10d4a9;
          printf("%s: recipientNonce in reply: ",pname);
          lVar4 = 0;
          do {
            pFStack_930 = (FILE *)0x10d4c6;
            printf("%02X",(ulong)(byte)pFVar24->_IO_save_end[lVar4]);
            lVar4 = lVar4 + 1;
          } while (lVar4 != 0x10);
          pFStack_930 = (FILE *)0x10d4d9;
          putchar(10);
        }
        piVar9 = &v_flag;
        pcVar12 = (char *)&pFVar24->_mode;
        lVar4 = 0;
        do {
          if (pFVar24->_IO_save_base[lVar4] != pFVar24->_IO_save_end[lVar4]) {
            if (v_flag != 0) {
              pFStack_930 = (FILE *)0x10d770;
              pkcs7_unwrap_cold_8();
            }
            break;
          }
          lVar4 = lVar4 + 1;
        } while (lVar4 != 0x10);
        pFVar33 = (FILE *)(ulong)(uint)nid_pkiStatus;
        buffer_00 = (EVP_PKEY **)auStack_920;
        pFStack_930 = (FILE *)0x10d52c;
        pcVar34 = (char *)ppcVar6;
        iVar2 = get_signed_attribute
                          ((stack_st_X509_ATTRIBUTE *)ppcVar6,nid_pkiStatus,0x13,(char **)buffer_00)
        ;
        if (iVar2 != 0) goto LAB_0010d7ac;
        pFStack_930 = (FILE *)0x10d53e;
        pcVar34 = (char *)auStack_920._0_8_;
        uVar3 = atoi((char *)auStack_920._0_8_);
        piVar9 = (int *)(ulong)uVar3;
        if (uVar3 == 0) {
          pcVar34 = "%s: pkistatus: SUCCESS\n";
LAB_0010d56e:
          pFStack_930 = (FILE *)0x10d57f;
          pFVar33 = (FILE *)pname;
          printf(pcVar34);
          *(uint *)&pFVar24->_IO_write_base = uVar3;
          piVar9 = &v_flag;
          if (uVar3 == 2) {
            pFVar33 = (FILE *)(ulong)(uint)nid_failInfo;
            buffer_00 = (EVP_PKEY **)auStack_920;
            pFStack_930 = (FILE *)0x10d5ab;
            pcVar34 = (char *)ppcVar6;
            iVar2 = get_signed_attribute
                              ((stack_st_X509_ATTRIBUTE *)ppcVar6,nid_failInfo,0x13,
                               (char **)buffer_00);
            if (iVar2 != 0) goto LAB_0010d7b1;
            pFStack_930 = (FILE *)0x10d5bd;
            uVar3 = atoi((char *)auStack_920._0_8_);
            pcVar34 = (char *)auStack_920._0_8_;
            if (uVar3 < 5) {
              buffer_00 = (EVP_PKEY **)(ulong)uVar3;
              iVar2 = *(int *)(&DAT_0011144c + (long)buffer_00 * 4);
              *(uint *)&pFVar24->_IO_write_end = uVar3;
              pcVar34 = "%s: reason: %s\n";
              pFStack_930 = (FILE *)0x10d5f1;
              pFVar33 = (FILE *)pname;
              printf("%s: reason: %s\n",pname,&DAT_0011144c + iVar2);
              goto LAB_0010d5f1;
            }
            goto LAB_0010d7b6;
          }
LAB_0010d5f1:
          if (*(int *)&pFVar24->_IO_write_base != 0) {
            if ((v_flag != 0) && ((int)pFVar21 != 0)) {
              pFStack_930 = (FILE *)0x10d60f;
              pkcs7_unwrap_cold_12();
            }
            return 0;
          }
          if ((int)pFVar21 == 0) goto LAB_0010d7bb;
          if (pFVar24->_flags - 0x13U < 2) {
            ppXVar22 = (X509 **)&pFVar24->_fileno;
            buffer_00 = (EVP_PKEY **)&pFVar24->_old_offset;
          }
          else {
            ppXVar22 = &localcert;
            buffer_00 = &rsa;
          }
          ppcVar6 = (char **)*buffer_00;
          piVar9 = (int *)*ppXVar22;
          pFVar33 = (FILE *)0x0;
          pFStack_930 = (FILE *)0x10d64e;
          pcVar34 = (char *)pFVar19;
          pFVar20 = (FILE *)d2i_PKCS7_bio((BIO *)pFVar19,(PKCS7 **)0x0);
          if (pFVar20 == (FILE *)0x0) goto LAB_0010d7c0;
          if (d_flag != 0) {
            pFStack_930 = (FILE *)0x10d67e;
            printf("%s: printing PEM fomatted PKCS#7\n",pname);
            pFStack_930 = (FILE *)0x10d690;
            PEM_write_PKCS7(_stdout,(PKCS7 *)pFVar20);
          }
          pFStack_930 = (FILE *)0x10d695;
          pBVar5 = BIO_s_mem();
          pFStack_930 = (FILE *)0x10d69d;
          pFVar19 = (FILE *)BIO_new(pBVar5);
          if (d_flag != 0) {
            pFStack_930 = (FILE *)0x10d6c4;
            printf("%s: decrypting inner PKCS#7\n",pname);
          }
          pFStack_930 = (FILE *)0x10d6d8;
          buffer_00 = (EVP_PKEY **)pFVar19;
          pFVar33 = (FILE *)ppcVar6;
          pcVar34 = (char *)pFVar20;
          iVar2 = PKCS7_decrypt((PKCS7 *)pFVar20,(EVP_PKEY *)ppcVar6,(X509 *)piVar9,(BIO *)pFVar19,0
                               );
          if (iVar2 != 0) {
            pFStack_930 = (FILE *)0x10d6f1;
            BIO_ctrl((BIO *)pFVar19,0xb,0,(void *)0x0);
            pFStack_930 = (FILE *)0x10d703;
            uVar11 = BIO_ctrl((BIO *)pFVar19,3,0,pcVar12);
            *(int *)(pFVar24->_unused2 + 4) = (int)uVar11;
            if (v_flag != 0) {
              pFStack_930 = (FILE *)0x10d72f;
              printf("%s: PKCS#7 payload size: %d bytes\n",pname,uVar11 & 0xffffffff);
            }
            pFStack_930 = (FILE *)0x10d73c;
            BIO_set_flags((BIO *)pFVar19,0x200);
            pFStack_930 = (FILE *)0x10d746;
            pPVar17 = d2i_PKCS7_bio((BIO *)pFVar19,(PKCS7 **)0x0);
            pFVar24->__pad5 = (size_t)pPVar17;
            return 0;
          }
          goto LAB_0010d7c5;
        }
        if (uVar3 == 3) {
          pcVar34 = "%s: pkistatus: PENDING\n";
          goto LAB_0010d56e;
        }
        pFVar20 = pFVar21;
        if (uVar3 == 2) {
          pcVar34 = "%s: pkistatus: FAILURE\n";
          goto LAB_0010d56e;
        }
      }
      pFStack_930 = (FILE *)get_signed_attribute;
      pkcs7_unwrap_cold_16();
      pcStack_968 = (code *)0x10d7ea;
      pFStack_950 = pFVar24;
      pFStack_948 = (FILE *)pcVar12;
      pFStack_940 = pFVar19;
      pFStack_938 = (FILE *)ppcVar6;
      pFStack_930 = pFVar20;
      iVar2 = get_attribute((stack_st_X509_ATTRIBUTE *)pcVar34,(int)pFVar33,
                            (ASN1_TYPE **)&pFStack_958);
      if (iVar2 != 0) {
        if (v_flag == 0) {
          return 1;
        }
        pcStack_968 = (code *)0x10d8bf;
        get_signed_attribute_cold_1();
        return 1;
      }
      pcStack_968 = (code *)0x10d821;
      ppcVar29 = (char **)pFStack_958;
      uVar3 = ASN1_TYPE_get((ASN1_TYPE *)pFStack_958);
      if (uVar3 == extraout_EDX) {
        pcStack_968 = (code *)0x10d832;
        uVar3 = ASN1_STRING_length((ASN1_STRING *)pFStack_958->_IO_read_ptr);
        if ((int)uVar3 < 1) {
          return 1;
        }
        ppcVar6 = (char **)(ulong)uVar3;
        if (d_flag != 0) {
          pcStack_968 = (code *)0x10d860;
          pFVar33 = (FILE *)pname;
          printf("%s: allocating %d bytes for attribute\n",pname,ppcVar6);
        }
        ppcVar29 = (char **)(ulong)((extraout_EDX == 0x13) + uVar3);
        pcStack_968 = (code *)0x10d871;
        pcVar34 = (char *)malloc((size_t)ppcVar29);
        *buffer_00 = (EVP_PKEY *)pcVar34;
        if (pcVar34 != (char *)0x0) {
          pcStack_968 = (code *)0x10d885;
          __src = (void *)ASN1_STRING_get0_data((X509_ALGOR *)pFStack_958->_IO_read_ptr);
          pcStack_968 = (code *)0x10d896;
          memcpy(pcVar34,__src,(size_t)ppcVar6);
          if (extraout_EDX != 0x13) {
            return 0;
          }
          (*buffer_00)[(long)ppcVar6] = (EVP_PKEY)0x0;
          return 0;
        }
      }
      else {
        pcStack_968 = (code *)0x10d8c9;
        get_signed_attribute_cold_2();
      }
      pcStack_968 = get_attribute;
      get_signed_attribute_cold_3();
      pcVar34 = pname;
      pFStack_978 = pFStack_958;
      pFVar20 = (FILE *)((ulong)pFVar33 & 0xffffffff);
      pFStack_988 = (FILE *)buffer_00;
      pFStack_980 = (FILE *)pcVar12;
      pFStack_970 = (FILE *)ppcVar6;
      pcStack_968 = (code *)(ulong)extraout_EDX;
      if (d_flag != 0) {
        pFStack_990 = (FILE *)0x10d8fb;
        pcVar16 = OBJ_nid2sn((int)pFVar33);
        pFStack_990 = (FILE *)0x10d90f;
        printf("%s: finding attribute %s\n",pcVar34,pcVar16);
        ppcVar6 = (char **)pcVar34;
      }
      *(long *)extraout_RDX = 0;
      pFStack_990 = (FILE *)0x10d91d;
      pFVar19 = pFVar20;
      pFVar21 = (FILE *)OBJ_nid2obj((int)pFVar33);
      if (pFVar21 != (FILE *)0x0) {
        pFStack_990 = (FILE *)0x10d92d;
        iVar2 = OPENSSL_sk_num(ppcVar29);
        if (0 < iVar2) {
          pFVar20 = (FILE *)0x0;
          do {
            pFStack_990 = (FILE *)0x10d93d;
            pcVar12 = (char *)OPENSSL_sk_value(ppcVar29,pFVar20);
            pFStack_990 = (FILE *)0x10d948;
            pAVar8 = X509_ATTRIBUTE_get0_object((X509_ATTRIBUTE *)pcVar12);
            pFStack_990 = (FILE *)0x10d953;
            iVar2 = OBJ_cmp(pAVar8,(ASN1_OBJECT *)pFVar21);
            if (iVar2 == 0) {
              pFStack_990 = (FILE *)0x10d95f;
              pFVar19 = (FILE *)pcVar12;
              iVar2 = X509_ATTRIBUTE_count((X509_ATTRIBUTE *)pcVar12);
              if (iVar2 != 0) {
                if (*(long *)extraout_RDX != 0) {
                  pFStack_990 = (FILE *)0x10d99b;
                  get_attribute_cold_1();
                  ppcVar6 = (char **)pFVar21;
                  goto LAB_0010d99b;
                }
                pFStack_990 = (FILE *)0x10d973;
                pAVar23 = X509_ATTRIBUTE_get0_type((X509_ATTRIBUTE *)pcVar12,0);
                *(ASN1_TYPE **)extraout_RDX = pAVar23;
              }
            }
            uVar3 = (int)pFVar20 + 1;
            pFVar20 = (FILE *)(ulong)uVar3;
            pFStack_990 = (FILE *)0x10d980;
            iVar2 = OPENSSL_sk_num(ppcVar29);
          } while ((int)uVar3 < iVar2);
        }
        return (int)(*(long *)extraout_RDX == 0);
      }
LAB_0010d99b:
      pFStack_990 = (FILE *)write_crl;
      get_attribute_cold_2();
      pFVar19 = *(FILE **)(*(long *)(pFVar19->__pad5 + 0x20) + 0x18);
      pFStack_9a8 = (FILE *)0x10d9bb;
      pFStack_998 = (FILE *)ppcVar29;
      pFStack_990 = (FILE *)ppcVar6;
      pFVar21 = (FILE *)OPENSSL_sk_value(pFVar19,0);
      if (pFVar21 == (FILE *)0x0) {
        pFStack_9a8 = (FILE *)0x10da68;
        write_crl_cold_3();
LAB_0010da68:
        pFStack_9a8 = (FILE *)0x10da6d;
        write_crl_cold_2();
        pFVar24 = extraout_RDX;
      }
      else {
        ppcVar6 = &w_char;
        pFStack_9a8 = (FILE *)0x10d9dd;
        pFVar19 = (FILE *)w_char;
        pFVar24 = fopen(w_char,"w");
        ppcVar29 = (char **)pFVar21;
        if (pFVar24 == (FILE *)0x0) goto LAB_0010da68;
        if (v_flag != 0) {
          pFStack_9a8 = (FILE *)0x10da0d;
          printf("%s: writing CRL\n",pname);
        }
        if (d_flag != 0) {
          pFStack_9a8 = (FILE *)0x10da2b;
          PEM_write_X509_CRL(_stdout,(X509_CRL *)pFVar21);
        }
        pFStack_9a8 = (FILE *)0x10da36;
        pFVar19 = pFVar24;
        iVar2 = PEM_write_X509_CRL(pFVar24,(X509_CRL *)pFVar21);
        if (iVar2 == 1) {
          pFStack_9a8 = (FILE *)0x10da56;
          printf("%s: CRL written as %s\n",pname,w_char);
          iVar2 = fclose(pFVar24);
          return iVar2;
        }
      }
      pFStack_9a8 = (FILE *)write_local_cert;
      write_crl_cold_1();
      localcert = (X509 *)0x0;
      pFVar19 = *(FILE **)(*(long *)(pFVar19->__pad5 + 0x20) + 0x10);
      piVar36 = &v_flag;
      pFStack_9d0 = pFVar24;
      pFStack_9c8 = (FILE *)pcVar12;
      pFStack_9c0 = (FILE *)piVar9;
      pFStack_9b8 = (FILE *)ppcVar29;
      pFStack_9b0 = (FILE *)ppcVar6;
      pFStack_9a8 = pFVar20;
      if (v_flag != 0) {
        pFStack_19e0 = (FILE *)0x10dab3;
        uVar3 = OPENSSL_sk_num(pFVar19);
        pFStack_19e0 = (FILE *)0x10dac3;
        printf("write_local_cert(): found %d cert(s)\n",(ulong)uVar3);
      }
      pFStack_19e0 = (FILE *)0x10dacb;
      pFVar21 = pFVar19;
      iVar2 = OPENSSL_sk_num();
      pFVar24 = (FILE *)localcert;
      if (0 < iVar2) {
        ppcVar29 = (char **)0x0;
        do {
          pFStack_19e0 = (FILE *)0x10dae1;
          piVar9 = (int *)OPENSSL_sk_value(pFVar19,ppcVar29);
          pcVar34 = pname;
          if (v_flag != 0) {
            pFStack_19e0 = (FILE *)0x10db01;
            pXVar25 = X509_get_subject_name((X509 *)piVar9);
            pFStack_19e0 = (FILE *)0x10db14;
            pcVar12 = X509_NAME_oneline(pXVar25,(char *)aFStack_19d8,0x400);
            pFStack_19e0 = (FILE *)0x10db28;
            printf("%s: found certificate with\n  subject: \'%s\'\n",pcVar34,pcVar12);
            pFStack_19e0 = (FILE *)0x10db30;
            pXVar25 = X509_get_issuer_name((X509 *)piVar9);
            pFStack_19e0 = (FILE *)0x10db40;
            pcVar34 = X509_NAME_oneline(pXVar25,(char *)aFStack_19d8,0x400);
            pFStack_19e0 = (FILE *)0x10db51;
            printf("  issuer: %s\n",pcVar34);
            pFStack_19e0 = (FILE *)0x10db5d;
            pXVar25 = (X509_NAME *)X509_REQ_get_subject_name(request);
            pFStack_19e0 = (FILE *)0x10db6d;
            pcVar34 = X509_NAME_oneline(pXVar25,(char *)aFStack_19d8,0x400);
            pFStack_19e0 = (FILE *)0x10db7e;
            printf("  request_subject: \'%s\'\n",pcVar34);
            pFVar20 = aFStack_19d8;
          }
          pFStack_19e0 = (FILE *)0x10db86;
          pXVar25 = X509_get_subject_name((X509 *)piVar9);
          pFStack_19e0 = (FILE *)0x10db95;
          b_01 = (X509_NAME *)X509_REQ_get_subject_name(request);
          pFStack_19e0 = (FILE *)0x10dba0;
          iVar2 = X509_NAME_cmp(pXVar25,b_01);
          if (d_flag != 0) {
            pFStack_19e0 = (FILE *)0x10dc81;
            write_local_cert_cold_1();
          }
          if (iVar2 == 0) {
LAB_0010dc26:
            if (v_flag != 0) {
              pFStack_19e0 = (FILE *)0x10dc39;
              puts("CN\'s of request and certificate matched!");
            }
          }
          else {
            pFStack_19e0 = (FILE *)0x10dbc0;
            pXVar25 = X509_get_subject_name((X509 *)piVar9);
            pFStack_19e0 = (FILE *)0x10dbd8;
            X509_NAME_oneline(pXVar25,acStack_11d8,0x400);
            pFStack_19e0 = (FILE *)0x10dbe4;
            pXVar25 = (X509_NAME *)X509_REQ_get_subject_name(request);
            pFVar20 = aFStack_15d8;
            pFStack_19e0 = (FILE *)0x10dbfc;
            X509_NAME_oneline(pXVar25,(char *)pFVar20,0x400);
            if (v_flag != 0) {
              pFStack_19e0 = (FILE *)0x10dc17;
              printf(" X509_NAME_cmp() workaround: strcmp request subject (%s) to cert subject (%s)\n"
                     ,pFVar20,acStack_11d8);
            }
            pFStack_19e0 = (FILE *)0x10dc22;
            iVar2 = strcmp(acStack_11d8,(char *)pFVar20);
            if (iVar2 == 0) goto LAB_0010dc26;
            pFStack_19e0 = (FILE *)0x10dc8b;
            write_local_cert_cold_2();
          }
          pFStack_19e0 = (FILE *)0x10dc41;
          ppcVar6 = (char **)X509_get_subject_name((X509 *)piVar9);
          pFStack_19e0 = (FILE *)0x10dc4c;
          pXVar25 = X509_get_issuer_name((X509 *)piVar9);
          pFStack_19e0 = (FILE *)0x10dc57;
          pFVar21 = (FILE *)ppcVar6;
          iVar2 = X509_NAME_cmp((X509_NAME *)ppcVar6,pXVar25);
          pFVar24 = (FILE *)piVar9;
          if (iVar2 != 0) break;
          uVar3 = (int)ppcVar29 + 1;
          ppcVar29 = (char **)(ulong)uVar3;
          pFStack_19e0 = (FILE *)0x10dc66;
          pFVar21 = pFVar19;
          iVar2 = OPENSSL_sk_num();
          pFVar24 = (FILE *)localcert;
        } while ((int)uVar3 < iVar2);
      }
      localcert = (X509 *)pFVar24;
      if (localcert == (X509 *)0x0) {
        pFStack_19e0 = (FILE *)0x10dd37;
        write_local_cert_cold_5();
LAB_0010dd37:
        pFStack_19e0 = (FILE *)0x10dd3c;
        write_local_cert_cold_4();
      }
      else {
        ppcVar29 = &l_char;
        pFStack_19e0 = (FILE *)0x10dcb8;
        pFVar21 = (FILE *)l_char;
        pFVar24 = fopen(l_char,"w");
        if (pFVar24 == (FILE *)0x0) goto LAB_0010dd37;
        if (v_flag != 0) {
          pFStack_19e0 = (FILE *)0x10dce2;
          printf("%s: certificate written as %s\n",pname,l_char);
        }
        if (d_flag != 0) {
          pFStack_19e0 = (FILE *)0x10dd04;
          PEM_write_X509(_stdout,(X509 *)localcert);
        }
        pFStack_19e0 = (FILE *)0x10dd13;
        pFVar21 = pFVar24;
        iVar2 = PEM_write_X509(pFVar24,(X509 *)localcert);
        pFVar19 = pFVar24;
        if (iVar2 == 1) {
          pFStack_19e0 = (FILE *)0x10dd20;
          iVar2 = fclose(pFVar24);
          return iVar2;
        }
      }
      pFStack_19e0 = (FILE *)write_other_cert;
      write_local_cert_cold_3();
      piStack_1a00 = &v_flag;
      ppcVar37 = *(char ***)(*(long *)(pFVar21->__pad5 + 0x20) + 0x10);
      pFStack_1e28 = (FILE *)0x10dd6e;
      pFVar24 = (FILE *)ppcVar37;
      pFStack_1e18 = pFVar21;
      pFStack_1a08 = pFVar19;
      pFStack_19f8 = (FILE *)piVar9;
      pFStack_19f0 = (FILE *)ppcVar29;
      pFStack_19e8 = (FILE *)ppcVar6;
      pFStack_19e0 = pFVar20;
      iVar2 = OPENSSL_sk_num();
      pFVar19 = (FILE *)0x0;
      if (0 < iVar2) {
        piVar9 = (int *)0x0;
        do {
          pFStack_1e28 = (FILE *)0x10dd86;
          pFVar20 = (FILE *)OPENSSL_sk_value(ppcVar37,piVar9);
          pcVar34 = pname;
          if (v_flag != 0) {
            pFStack_1e28 = (FILE *)0x10dda7;
            pXVar25 = X509_get_subject_name((X509 *)pFVar20);
            ppcVar29 = (char **)aFStack_1e10;
            pFStack_1e28 = (FILE *)0x10ddbc;
            pcVar12 = X509_NAME_oneline(pXVar25,(char *)ppcVar29,0x400);
            pFStack_1e28 = (FILE *)0x10ddd0;
            printf("%s: found certificate with\n  subject: %s\n",pcVar34,pcVar12);
            pFStack_1e28 = (FILE *)0x10ddd8;
            pXVar25 = X509_get_issuer_name((X509 *)pFVar20);
            pFStack_1e28 = (FILE *)0x10dde8;
            pcVar12 = X509_NAME_oneline(pXVar25,(char *)ppcVar29,0x400);
            pFStack_1e28 = (FILE *)0x10ddf9;
            printf("  issuer: %s\n",pcVar12);
            piVar36 = (int *)pcVar34;
          }
          pFStack_1e28 = (FILE *)0x10de01;
          pFVar24 = (FILE *)X509_get_serialNumber((X509 *)pFVar20);
          pFStack_1e28 = (FILE *)0x10de19;
          iVar2 = ASN1_INTEGER_cmp((ASN1_INTEGER *)pFVar24,
                                   *(ASN1_INTEGER **)((long)pFStack_1e18->__pad3 + 8));
          pFVar19 = pFVar20;
          if (iVar2 == 0) break;
          uVar3 = (int)piVar9 + 1;
          piVar9 = (int *)(ulong)uVar3;
          pFStack_1e28 = (FILE *)0x10de2c;
          pFVar24 = (FILE *)ppcVar37;
          iVar2 = OPENSSL_sk_num();
          pFVar19 = (FILE *)0x0;
        } while ((int)uVar3 < iVar2);
      }
      if (pFVar19 == (FILE *)0x0) {
        pFStack_1e28 = (FILE *)0x10ded0;
        write_other_cert_cold_3();
      }
      else {
        ppcVar37 = &w_char;
        pFStack_1e28 = (FILE *)0x10de54;
        pFVar24 = (FILE *)w_char;
        pFVar21 = fopen(w_char,"w");
        if (pFVar21 != (FILE *)0x0) {
          if (v_flag != 0) {
            pFStack_1e28 = (FILE *)0x10de83;
            printf("%s: certificate written as %s\n",pname,w_char);
          }
          if (d_flag != 0) {
            pFStack_1e28 = (FILE *)0x10dea1;
            PEM_write_X509(_stdout,(X509 *)pFVar19);
          }
          pFStack_1e28 = (FILE *)0x10deac;
          pFVar24 = pFVar21;
          iVar2 = PEM_write_X509(pFVar21,(X509 *)pFVar19);
          ppcVar29 = (char **)pFVar21;
          if (iVar2 == 1) {
            pFStack_1e28 = (FILE *)0x10deb9;
            iVar2 = fclose(pFVar21);
            return iVar2;
          }
          goto LAB_0010ded5;
        }
      }
      pFStack_1e28 = (FILE *)0x10ded5;
      write_other_cert_cold_2();
LAB_0010ded5:
      pFStack_1e28 = (FILE *)write_ca_ra;
      write_other_cert_cold_1();
      pFStack_1e50 = pFVar19;
      piStack_1e48 = piVar36;
      pFStack_1e40 = (FILE *)piVar9;
      pFStack_1e38 = (FILE *)ppcVar29;
      pFStack_1e30 = (FILE *)ppcVar37;
      pFStack_1e28 = pFVar20;
      pBVar10 = BIO_new_mem_buf(pFVar24->_IO_read_end,*(int *)&pFVar24->_IO_read_base);
      pPVar17 = d2i_PKCS7_bio(pBVar10,(PKCS7 **)0x0);
      if (pPVar17 == (PKCS7 *)0x0) {
        pcVar34 = "%s: error reading PKCS#7 data\n";
LAB_0010df27:
        fprintf(_stderr,pcVar34,pname);
LAB_0010df31:
        ERR_print_errors_fp(_stderr);
      }
      else {
        iVar2 = OBJ_obj2nid(pPVar17->type);
        if (iVar2 == 0x16) {
          lVar4 = ((pPVar17->d).data)->flags;
          if (lVar4 != 0) {
            pPStack_26b0 = pPVar17;
            pBStack_26a8 = pBVar10;
            iVar2 = OPENSSL_sk_num(lVar4);
            if (0 < iVar2) {
              uVar11 = 0;
              lStack_26a0 = lVar4;
              do {
                memset(acStack_2658,0,0x400);
                memset(acStack_2258,0,0x400);
                pXVar7 = (X509 *)OPENSSL_sk_value(lVar4,uVar11);
                snprintf(acStack_2258,0x400,"%s-%d",c_char,uVar11);
                pcVar34 = pname;
                if (v_flag != 0) {
                  pXVar25 = X509_get_subject_name(pXVar7);
                  pcVar12 = X509_NAME_oneline(pXVar25,acStack_2658,0x400);
                  printf("\n%s: found certificate with\n  subject: %s\n",pcVar34,pcVar12);
                }
                if (v_flag != 0) {
                  pXVar25 = X509_get_issuer_name(pXVar7);
                  pcVar34 = X509_NAME_oneline(pXVar25,acStack_2658,0x400);
                  printf("  issuer: %s\n",pcVar34);
                }
                iVar2 = X509_digest(pXVar7,(EVP_MD *)fp_alg,abStack_2698,&uStack_26b4);
                if (iVar2 == 0) goto LAB_0010df31;
                iVar2 = X509_get_ext_by_NID(pXVar7,0x57,-1);
                if (iVar2 < 0) {
                  if (v_flag != 0) {
                    puts("  basic constraints: (not included)");
                  }
                }
                else {
                  pXVar26 = X509_get_ext(pXVar7,iVar2);
                  if (v_flag != 0) {
                    printf("  basic constraints: ");
                    X509V3_EXT_print_fp(_stdout,pXVar26,0,0);
                    putchar(10);
                  }
                }
                iVar2 = X509_get_ext_by_NID(pXVar7,0x53,-1);
                if (iVar2 < 0) {
                  if (v_flag != 0) {
                    puts("  usage: (not included)");
                  }
                }
                else {
                  pXVar26 = X509_get_ext(pXVar7,iVar2);
                  if (v_flag != 0) {
                    printf("  usage: ");
                    X509V3_EXT_print_fp(_stdout,pXVar26,0,0);
                    putchar(10);
                  }
                }
                if (v_flag != 0) {
                  iVar2 = EVP_MD_get_type(fp_alg);
                  pcVar34 = OBJ_nid2sn(iVar2);
                  printf("  %s fingerprint: ",pcVar34);
                  uVar30 = (ulong)uStack_26b4;
                  if (0 < (int)uStack_26b4) {
                    uVar27 = 0;
                    do {
                      uVar1 = uVar27 + 1;
                      uVar31 = 10;
                      if (uVar1 != (uVar30 & 0xffffffff)) {
                        uVar31 = 0x3a;
                      }
                      printf("%02X%c",(ulong)abStack_2698[uVar27],uVar31);
                      uVar30 = (ulong)(int)uStack_26b4;
                      uVar27 = uVar1;
                    } while ((long)uVar1 < (long)uVar30);
                  }
                }
                pFVar20 = fopen(acStack_2258,"w");
                if (pFVar20 == (FILE *)0x0) {
                  pcVar34 = "%s: cannot open cert file for writing\n";
                  goto LAB_0010df71;
                }
                if (v_flag != 0) {
                  printf("%s: certificate written as %s\n",pname,acStack_2258);
                }
                if (d_flag != 0) {
                  PEM_write_X509(_stdout,pXVar7);
                }
                iVar2 = PEM_write_X509(pFVar20,pXVar7);
                if (iVar2 != 1) {
                  pcVar34 = "%s: error while writing certificate file\n";
                  goto LAB_0010df27;
                }
                fclose(pFVar20);
                lVar4 = lStack_26a0;
                uVar3 = (int)uVar11 + 1;
                uVar11 = (ulong)uVar3;
                iVar2 = OPENSSL_sk_num(lStack_26a0);
              } while ((int)uVar3 < iVar2);
            }
            PKCS7_free(pPStack_26b0);
            BIO_free(pBStack_26a8);
            exit(0);
          }
          pcVar34 = "%s: cannot find certificates\n";
LAB_0010df71:
          fprintf(_stderr,pcVar34,pname);
        }
        else {
          printf("%s: wrong PKCS#7 type\n",pname);
        }
      }
      exit(0x5d);
    }
  }
  pFStack_4e8 = (FILE *)0x10d084;
  pkcs7_verify_unwrap_cold_9();
LAB_0010d084:
  pFStack_4e8 = (FILE *)0x10d09c;
  printf("%s: error verifying signature Error \n",pname);
  pFStack_4e8 = (FILE *)0x10d0ab;
  ERR_print_errors_fp(_stderr);
  pFStack_4e8 = (FILE *)0x10d0b5;
  exit(0x61);
}

Assistant:

int pkcs7_wrap(struct scep *s, int enc_base64) {
	BIO			*databio = NULL;
	BIO			*encbio = NULL;
	BIO			*pkcs7bio = NULL;
	BIO			*memorybio = NULL;
	BIO			*outbio = NULL;
	BIO			*base64bio = NULL;
	unsigned char		*buffer = NULL;
	int			rc, len = 0;
	int i=0;
	STACK_OF(X509)		*recipients;
	PKCS7			*p7enc;
	PKCS7_SIGNER_INFO	*si;
	STACK_OF(X509_ATTRIBUTE) *attributes;
	X509			*signercert = NULL;
	EVP_PKEY		*signerkey = NULL;

	/* Create a new sender nonce for all messages
	 * XXXXXXXXXXXXXX should it be per transaction? */
	s->sender_nonce_len = 16;
	s->sender_nonce = generate_nonce(s->sender_nonce_len);

	/* Prepare data payload */
	switch(s->request_type) {
		case SCEP_REQUEST_PKCSREQ:
			/*
			 * Set printable message type
			 * We set this later as an autheticated attribute
			 * "messageType".
			 */
			s->request_type_str = SCEP_REQUEST_PKCSREQ_STR;

			/* Signer cert */
			signercert = s->signercert;
			signerkey = s->signerkey;

			/* Create inner PKCS#7  */
			if (d_flag)
				printf("%s: creating inner PKCS#7\n", pname);

			/* Read request in memory bio */
			databio = BIO_new(BIO_s_mem());
			if ((rc = i2d_X509_REQ_bio(databio, request)) <= 0) {
				fprintf(stderr, "%s: error writing "
					"certificate request in bio\n", pname);
				ERR_print_errors_fp(stderr);
				exit (SCEP_PKISTATUS_P7);
			}else{
				if (d_flag)
					printf("%s: inner PKCS#7 in mem BIO \n", pname);

			}
			break;

		case SCEP_REQUEST_GETCERTINIT:

			/* Set printable message type */
			s->request_type_str = SCEP_REQUEST_GETCERTINIT_STR;

			/* Signer cert */
			signercert = s->signercert;
			signerkey = s->signerkey;

			/* Create inner PKCS#7  */
			if (d_flag)
				printf("%s: creating inner PKCS#7\n", pname);

			/* Read data in memory bio */
			databio = BIO_new(BIO_s_mem());
			if ((rc = i2d_PKCS7_ISSUER_AND_SUBJECT_bio(databio,
						s->ias_getcertinit)) <= 0) {
				fprintf(stderr, "%s: error writing "
					"GetCertInitial data in bio\n", pname);
				ERR_print_errors_fp(stderr);
				exit (SCEP_PKISTATUS_P7);
			}
			break;

		case SCEP_REQUEST_GETCERT:
			/* Set printable message type */
			s->request_type_str = SCEP_REQUEST_GETCERT_STR;

			/* Signer cert */
			signercert = localcert;
			signerkey = rsa;

			/* Read data in memory bio */
			databio = BIO_new(BIO_s_mem());
			if ((rc = i2d_PKCS7_ISSUER_AND_SERIAL_bio(databio,
						s->ias_getcert)) <= 0) {
				fprintf(stderr, "%s: error writing "
					"GetCert data in bio\n", pname);
				ERR_print_errors_fp(stderr);
				exit (SCEP_PKISTATUS_P7);
			}
			break;

		case SCEP_REQUEST_GETCRL:
			/* Set printable message type */
			s->request_type_str = SCEP_REQUEST_GETCRL_STR;

			/* Signer cert */
			signercert = localcert;
			signerkey = rsa;

			/* Read data in memory bio */
			databio = BIO_new(BIO_s_mem());
			if ((rc = i2d_PKCS7_ISSUER_AND_SERIAL_bio(databio,
						s->ias_getcrl)) <= 0) {
				fprintf(stderr, "%s: error writing "
					"GetCRL data in bio\n", pname);
				ERR_print_errors_fp(stderr);
				exit (SCEP_PKISTATUS_P7);
			}

			break;
	}


	if( BIO_flush(databio) <= 0 ){
		fprintf(stderr, "%s: error flushing databio\n", pname);
	}
	BIO_set_flags(databio, BIO_FLAGS_MEM_RDONLY);

	/* Below this is the common code for all request_type */

	/* Read in the payload */
	s->request_len = BIO_get_mem_data(databio, &s->request_payload);
	if (v_flag){
		printf("%s: request data dump \n", pname);
		PEM_write_X509_REQ(stdout, request);
	}

	if (v_flag)
		printf("%s: data payload size: %d bytes\n", pname,
				s->request_len);


	/* Create encryption certificate stack */
	if ((recipients = sk_X509_new(NULL)) == NULL) {
		fprintf(stderr, "%s: error creating "
					"certificate stack\n", pname);
		ERR_print_errors_fp(stderr);
		exit (SCEP_PKISTATUS_P7);
	}
	/*
	 * Use different CA cert for encryption if requested.
	 * encert will be non-NULL if the -e option was specified on the command
	 * line, or if the certificates were auto-selected.
	 */
	if (encert != NULL) {
		if (sk_X509_push(recipients, encert) <= 0) {
			fprintf(stderr, "%s: error adding recipient encryption "
					"certificate\n", pname);
			ERR_print_errors_fp(stderr);
			exit (SCEP_PKISTATUS_P7);
		}
	/* Use same CA cert also for encryption */
	} else {
		if (sk_X509_push(recipients, cacert) <= 0) {
			fprintf(stderr, "%s: error adding recipient encryption "
					"certificate\n", pname);
			ERR_print_errors_fp(stderr);
			exit (SCEP_PKISTATUS_P7);
		}
	}

	/* Create BIO for encryption  */
	if (d_flag){
		printf("\n %s: hexdump request payload\n", pname);
		for(i=0; i < s->request_len; i++ ){
			printf("%02x", s->request_payload[i]);
		}
		printf("\n %s: hexdump payload %d \n", pname , i);

	}


	if ((encbio = BIO_new_mem_buf(s->request_payload,
				s->request_len)) == NULL) {
		fprintf(stderr, "%s: error creating data " "bio\n", pname);
		ERR_print_errors_fp(stderr);
		exit (SCEP_PKISTATUS_P7);
	}

	/* Encrypt */
	if (!(p7enc = PKCS7_encrypt(recipients, encbio,
					enc_alg, PKCS7_BINARY))) {
		fprintf(stderr, "%s: request payload encrypt failed\n", pname);
		ERR_print_errors_fp(stderr);
		exit (SCEP_PKISTATUS_P7);
	}
	if (v_flag)
		printf("%s: successfully encrypted payload\n", pname);

	/* Write encrypted data */
	memorybio = BIO_new(BIO_s_mem());
	if (i2d_PKCS7_bio(memorybio, p7enc) <= 0) {
		fprintf(stderr, "%s: error writing encrypted data\n", pname);
		ERR_print_errors_fp(stderr);
		exit (SCEP_PKISTATUS_P7);
	}
	BIO_flush(memorybio);
	BIO_set_flags(memorybio, BIO_FLAGS_MEM_RDONLY);
	len = BIO_get_mem_data(memorybio, &buffer);
	if (v_flag)
		printf("%s: envelope size: %d bytes\n", pname, len);
	if (d_flag) {
		printf("%s: printing PEM fomatted PKCS#7\n", pname);
		PEM_write_PKCS7(stdout, p7enc);
	}
	BIO_free(memorybio);

	/* Create outer PKCS#7  */
	if (v_flag)
		printf("%s: creating outer PKCS#7\n", pname);
	s->request_p7 = PKCS7_new();
	if (s->request_p7 == NULL) {
		fprintf(stderr, "%s: failed creating PKCS#7 for signing\n",
					pname);
		ERR_print_errors_fp(stderr);
		exit (SCEP_PKISTATUS_P7);
	}
	if (!PKCS7_set_type(s->request_p7, NID_pkcs7_signed)) {
		fprintf(stderr, "%s: failed setting PKCS#7 type\n", pname);
		ERR_print_errors_fp(stderr);
		exit (SCEP_PKISTATUS_P7);
	}

	/* Add signer certificate  and signature */
	PKCS7_add_certificate(s->request_p7, signercert);
	if ((si = PKCS7_add_signature(s->request_p7,
				signercert, signerkey, sig_alg)) == NULL) {
		fprintf(stderr, "%s: error adding PKCS#7 signature\n", pname);
		ERR_print_errors_fp(stderr);
		exit (SCEP_PKISTATUS_P7);
	}
	if (d_flag)
		printf("%s: signature added successfully\n", pname);

	/* Set signed attributes */
	if (d_flag)
		printf("%s: adding signed attributes\n", pname);
	attributes = sk_X509_ATTRIBUTE_new_null();
	add_attribute_string(attributes, nid_transId, s->transaction_id);
	add_attribute_string(attributes, nid_messageType, s->request_type_str);
	add_attribute_octet(attributes, nid_senderNonce, s->sender_nonce,
			s->sender_nonce_len);
	PKCS7_set_signed_attributes(si, attributes);
	/* Add contentType */
	if (!PKCS7_add_signed_attribute(si, NID_pkcs9_contentType,
			V_ASN1_OBJECT, OBJ_nid2obj(NID_pkcs7_data))) {
		fprintf(stderr, "%s: error adding NID_pkcs9_contentType\n",
					pname);
		ERR_print_errors_fp(stderr);
		exit (SCEP_PKISTATUS_P7);
	}

	/* Create new content */
	if (!PKCS7_content_new(s->request_p7, NID_pkcs7_data)) {
		fprintf(stderr, "%s: failed setting PKCS#7 content type\n",
					pname);
		ERR_print_errors_fp(stderr);
		exit (SCEP_PKISTATUS_P7);
	}

	/* Write data  */
	pkcs7bio = PKCS7_dataInit(s->request_p7, NULL);
	if (pkcs7bio == NULL) {
		fprintf(stderr, "%s: error opening bio for writing PKCS#7 "
			"data\n", pname);
		ERR_print_errors_fp(stderr);
		exit (SCEP_PKISTATUS_P7);
	}
	if (len != BIO_write(pkcs7bio, buffer, len)) {
		fprintf(stderr, "%s: error writing PKCS#7 data\n", pname);
		ERR_print_errors_fp(stderr);
		exit (SCEP_PKISTATUS_P7);
	}
	if (v_flag)
		printf("%s: PKCS#7 data written successfully\n", pname);

	/* Finalize PKCS#7  */
	if (!PKCS7_dataFinal(s->request_p7, pkcs7bio)) {
		fprintf(stderr, "%s: error finalizing outer PKCS#7\n", pname);
		ERR_print_errors_fp(stderr);
		exit (SCEP_PKISTATUS_P7);
	}
	if (d_flag) {
		printf("%s: printing PEM fomatted PKCS#7\n", pname);
		PEM_write_PKCS7(stdout, s->request_p7);
	}

	/* base64-encode the data */
	if (v_flag && enc_base64)
		printf("%s: applying base64 encoding\n",pname);

	/* Create base64 filtering bio */
	memorybio = BIO_new(BIO_s_mem());
	base64bio = BIO_new(BIO_f_base64());
	if (enc_base64)
		outbio = BIO_push(base64bio, memorybio);
	else
		outbio = memorybio;

	/* Copy PKCS#7 */
	i2d_PKCS7_bio(outbio, s->request_p7);
	BIO_flush(outbio);
	BIO_set_flags(memorybio, BIO_FLAGS_MEM_RDONLY);
	s->request_len = BIO_get_mem_data(memorybio, &s->request_payload);
	if (v_flag)
		printf("%s: %spayload size: %d bytes\n",
				pname,
				enc_base64 ? "base64 encoded " : "",
				s->request_len);
	BIO_free(outbio);
	BIO_free(databio);
	return (0);
}